

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

int __thiscall LZ77Compressor::remove(LZ77Compressor *this,char *__filename)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  int in_EDX;
  long lVar4;
  long lVar5;
  
  uVar3 = (ulong)(byte)__filename[(long)in_EDX + 2] << 2 ^
          (ulong)((uint)(byte)__filename[(long)in_EDX + 1] * 2) ^ (ulong)(byte)__filename[in_EDX];
  piVar1 = this->dict[uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = this->dict[uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)piVar2 - (long)piVar1 != 0) {
    lVar5 = (long)piVar2 - (long)piVar1 >> 2;
    lVar4 = 0;
    do {
      if (piVar1[lVar4] == in_EDX) {
        piVar1[lVar4] = piVar2[-1];
        this->dict[uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar2 + -1;
        return (int)piVar1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
  }
  return (int)piVar1;
}

Assistant:

void remove(const uint8_t* bytes, int offset) {
		auto& v = dict[hash(bytes + offset)];
		for (size_t i = 0; i < v.size(); i++) {
			if (v[i] == offset) {
				v[i] = v.back();
				v.pop_back();
				return;
			}
		}
	}